

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall google::protobuf::DynamicMessage::~DynamicMessage(DynamicMessage *this)

{
  Descriptor *this_00;
  Cord *this_01;
  long *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CppType CVar5;
  CppStringType CVar6;
  ExtensionSet *this_02;
  FieldDescriptor *field_00;
  OneofDescriptor *this_03;
  char *pcVar7;
  int *piVar8;
  ArenaStringPtr *this_04;
  DynamicMapField *this_05;
  int __c;
  Message *message;
  void *field_ptr;
  void *field_ptr_1;
  FieldDescriptor *field;
  int i;
  Descriptor *descriptor;
  DynamicMessage *this_local;
  
  this_00 = (this->type_info_->class_data).descriptor;
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (this->type_info_->extensions_offset != -1) {
    this_02 = (ExtensionSet *)MutableExtensionsRaw(this);
    internal::ExtensionSet::~ExtensionSet(this_02);
  }
  field._4_4_ = 0;
  do {
    iVar3 = Descriptor::field_count(this_00);
    if (iVar3 <= (int)field._4_4_) {
      Message::~Message(&this->super_Message);
      return;
    }
    pcVar7 = (char *)(ulong)field._4_4_;
    field_00 = Descriptor::field(this_00,field._4_4_);
    bVar2 = anon_unknown_0::InRealOneof(field_00);
    if (bVar2) {
      this_03 = FieldDescriptor::containing_oneof(field_00);
      pcVar7 = OneofDescriptor::index(this_03,pcVar7,__c);
      piVar8 = (int *)MutableOneofCaseRaw(this,(int)pcVar7);
      iVar3 = *piVar8;
      iVar4 = FieldDescriptor::number(field_00);
      if (iVar3 == iVar4) {
        this_04 = (ArenaStringPtr *)MutableOneofFieldRaw(this,field_00);
        CVar5 = FieldDescriptor::cpp_type(field_00);
        if (CVar5 == CPPTYPE_STRING) {
          CVar6 = FieldDescriptor::cpp_string_type(field_00);
          if (CVar6 == kView) {
LAB_0041aa6a:
            internal::ArenaStringPtr::Destroy(this_04);
          }
          else if (CVar6 == kCord) {
            this_01 = (Cord *)(this_04->tagged_ptr_).ptr_;
            if (this_01 != (Cord *)0x0) {
              absl::lts_20250127::Cord::~Cord(this_01);
              ::operator_delete(this_01,0x10);
            }
          }
          else if (CVar6 == kString) goto LAB_0041aa6a;
        }
        else {
          CVar5 = FieldDescriptor::cpp_type(field_00);
          if ((CVar5 == CPPTYPE_MESSAGE) &&
             (plVar1 = (long *)(this_04->tagged_ptr_).ptr_, plVar1 != (long *)0x0)) {
            (**(code **)(*plVar1 + 8))();
          }
        }
      }
    }
    else {
      this_05 = (DynamicMapField *)MutableRaw<void>(this,field._4_4_);
      bVar2 = FieldDescriptor::is_repeated(field_00);
      if (bVar2) {
        CVar5 = FieldDescriptor::cpp_type(field_00);
        switch(CVar5) {
        case CPPTYPE_INT32:
          RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_05);
          break;
        case CPPTYPE_INT64:
          RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_05);
          break;
        case CPPTYPE_UINT32:
          RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_05);
          break;
        case CPPTYPE_UINT64:
          RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_05);
          break;
        case CPPTYPE_DOUBLE:
          RepeatedField<double>::~RepeatedField((RepeatedField<double> *)this_05);
          break;
        case CPPTYPE_FLOAT:
          RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_05);
          break;
        case CPPTYPE_BOOL:
          RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)this_05);
          break;
        case CPPTYPE_ENUM:
          RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_05);
          break;
        case CPPTYPE_STRING:
          CVar6 = FieldDescriptor::cpp_string_type(field_00);
          if (CVar6 == kView) {
LAB_0041abf6:
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)this_05);
          }
          else if (CVar6 == kCord) {
            RepeatedField<absl::lts_20250127::Cord>::~RepeatedField
                      ((RepeatedField<absl::lts_20250127::Cord> *)this_05);
          }
          else if (CVar6 == kString) goto LAB_0041abf6;
          break;
        case CPPTYPE_MESSAGE:
          bVar2 = anon_unknown_0::IsMapFieldInApi(field_00);
          if (bVar2) {
            internal::DynamicMapField::~DynamicMapField(this_05);
          }
          else {
            RepeatedPtrField<google::protobuf::Message>::~RepeatedPtrField
                      ((RepeatedPtrField<google::protobuf::Message> *)this_05);
          }
        }
      }
      else {
        CVar5 = FieldDescriptor::cpp_type(field_00);
        if (CVar5 == CPPTYPE_STRING) {
          CVar6 = FieldDescriptor::cpp_string_type(field_00);
          if (CVar6 == kView) {
LAB_0041ac9a:
            internal::ArenaStringPtr::Destroy((ArenaStringPtr *)this_05);
          }
          else if (CVar6 == kCord) {
            absl::lts_20250127::Cord::~Cord((Cord *)this_05);
          }
          else if (CVar6 == kString) goto LAB_0041ac9a;
        }
        else {
          CVar5 = FieldDescriptor::cpp_type(field_00);
          if ((((CVar5 == CPPTYPE_MESSAGE) && (bVar2 = is_prototype(this), !bVar2)) &&
              (plVar1 = (long *)(this_05->super_MapFieldBase).super_MapFieldBaseForParse.payload_.
                                _M_i, plVar1 != (long *)0x0)) && (plVar1 != (long *)0x0)) {
            (**(code **)(*plVar1 + 8))();
          }
        }
      }
    }
    field._4_4_ = field._4_4_ + 1;
  } while( true );
}

Assistant:

DynamicMessage::~DynamicMessage() {
  const Descriptor* descriptor = type_info_->class_data.descriptor;

  _internal_metadata_.Delete<UnknownFieldSet>();

  if (type_info_->extensions_offset != -1) {
    reinterpret_cast<ExtensionSet*>(MutableExtensionsRaw())->~ExtensionSet();
  }

  // We need to manually run the destructors for repeated fields and strings,
  // just as we ran their constructors in the DynamicMessage constructor.
  // We also need to manually delete oneof fields if it is set and is string
  // or message.
  // Additionally, if any singular embedded messages have been allocated, we
  // need to delete them, UNLESS we are the prototype message of this type,
  // in which case any embedded messages are other prototypes and shouldn't
  // be touched.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    if (InRealOneof(field)) {
      void* field_ptr = MutableOneofCaseRaw(field->containing_oneof()->index());
      if (*(reinterpret_cast<const int32_t*>(field_ptr)) == field->number()) {
        field_ptr = MutableOneofFieldRaw(field);
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              delete *reinterpret_cast<absl::Cord**>(field_ptr);
              break;
            case FieldDescriptor::CppStringType::kView:
              if (internal::EnableExperimentalMicroString()) {
                reinterpret_cast<MicroString*>(field_ptr)->Destroy();
                break;
              }
              [[fallthrough]];
            case FieldDescriptor::CppStringType::kString: {
              reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy();
              break;
            }
          }
        } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            delete *reinterpret_cast<Message**>(field_ptr);
        }
      }
      continue;
    }
    void* field_ptr = MutableRaw(i);

    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                  \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:               \
    reinterpret_cast<RepeatedField<LOWERCASE>*>(field_ptr) \
        ->~RepeatedField<LOWERCASE>();                     \
    break

        HANDLE_TYPE(INT32, int32_t);
        HANDLE_TYPE(INT64, int64_t);
        HANDLE_TYPE(UINT32, uint32_t);
        HANDLE_TYPE(UINT64, uint64_t);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT, float);
        HANDLE_TYPE(BOOL, bool);
        HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              reinterpret_cast<RepeatedField<absl::Cord>*>(field_ptr)
                  ->~RepeatedField<absl::Cord>();
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              reinterpret_cast<RepeatedPtrField<std::string>*>(field_ptr)
                  ->~RepeatedPtrField<std::string>();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            reinterpret_cast<DynamicMapField*>(field_ptr)->~DynamicMapField();
          } else {
            reinterpret_cast<RepeatedPtrField<Message>*>(field_ptr)
                ->~RepeatedPtrField<Message>();
          }
          break;
      }

    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kCord:
          reinterpret_cast<absl::Cord*>(field_ptr)->~Cord();
          break;
        case FieldDescriptor::CppStringType::kView:
          if (internal::EnableExperimentalMicroString()) {
            MutableRaw<MicroString>(i)->Destroy();
            break;
          }
          [[fallthrough]];
        case FieldDescriptor::CppStringType::kString: {
          reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy();
          break;
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          if (!is_prototype()) {
        Message* message = *reinterpret_cast<Message**>(field_ptr);
        if (message != nullptr) {
          delete message;
        }
      }
    }
  }
}